

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_matrix4.c
# Opt level: O0

char * test_matrix4_determinant_row_is_zero(void)

{
  short sVar1;
  float fVar2;
  undefined1 local_50 [4];
  float det;
  matrix4 m;
  
  matrix4_identity((matrix4 *)local_50);
  fVar2 = matrix4_determinant((matrix4 *)local_50);
  sVar1 = scalar_equalsf(fVar2,0.0);
  if (sVar1 == 0) {
    sVar1 = scalar_equalsf(fVar2,1.0);
    if (sVar1 == 0) {
      m.field_0._56_8_ = anon_var_dwarf_8c4;
    }
    else {
      matrix4_identity((matrix4 *)local_50);
      local_50 = (undefined1  [4])0x0;
      det = 0.0;
      m.field_0.m[0] = 0.0;
      m.field_0.m[1] = 0.0;
      fVar2 = matrix4_determinant((matrix4 *)local_50);
      sVar1 = scalar_equalsf(fVar2,0.0);
      if (sVar1 == 0) {
        m.field_0._56_8_ = anon_var_dwarf_8d0;
      }
      else {
        matrix4_identity((matrix4 *)local_50);
        m.field_0.m[2] = 0.0;
        m.field_0.m[3] = 0.0;
        m.field_0.m[4] = 0.0;
        m.field_0.m[5] = 0.0;
        fVar2 = matrix4_determinant((matrix4 *)local_50);
        sVar1 = scalar_equalsf(fVar2,0.0);
        if (sVar1 == 0) {
          m.field_0._56_8_ = anon_var_dwarf_8dc;
        }
        else {
          matrix4_identity((matrix4 *)local_50);
          m.field_0.m[6] = 0.0;
          m.field_0.m[7] = 0.0;
          m.field_0.m[8] = 0.0;
          m.field_0.m[9] = 0.0;
          fVar2 = matrix4_determinant((matrix4 *)local_50);
          sVar1 = scalar_equalsf(fVar2,0.0);
          if (sVar1 == 0) {
            m.field_0._56_8_ = anon_var_dwarf_8e8;
          }
          else {
            matrix4_identity((matrix4 *)local_50);
            m.field_0.m[10] = 0.0;
            m.field_0.m[0xb] = 0.0;
            m.field_0.m[0xc] = 0.0;
            m.field_0.m[0xd] = 0.0;
            fVar2 = matrix4_determinant((matrix4 *)local_50);
            sVar1 = scalar_equalsf(fVar2,0.0);
            if (sVar1 == 0) {
              m.field_0._56_8_ = anon_var_dwarf_8f4;
            }
            else {
              m.field_0._56_8_ = 0;
            }
          }
        }
      }
    }
  }
  else {
    m.field_0._56_8_ = anon_var_dwarf_8b8;
  }
  return (char *)m.field_0._56_8_;
}

Assistant:

static char *test_matrix4_determinant_row_is_zero(void)
{
	struct matrix4 m;
	HYP_FLOAT det;

	/* identity is not zero */
	matrix4_identity(&m);
	det = matrix4_determinant(&m);
	test_assert(!scalar_equals(det, 0));
	test_assert(scalar_equals(det, 1));

	/* when any row is zero, the determinant is zero */
	matrix4_identity(&m);
	m.r00 = 0.0; m.r01 = 0.0; m.r02 = 0.0; m.r03 = 0.0;
	det = matrix4_determinant(&m);
	test_assert(scalar_equals(det, 0));

	matrix4_identity(&m);
	m.r10 = 0.0; m.r11 = 0.0; m.r12 = 0.0; m.r13 = 0.0;
	det = matrix4_determinant(&m);
	test_assert(scalar_equals(det, 0));

	matrix4_identity(&m);
	m.r20 = 0.0; m.r21 = 0.0; m.r22 = 0.0; m.r23 = 0.0;
	det = matrix4_determinant(&m);
	test_assert(scalar_equals(det, 0));

	matrix4_identity(&m);
	m.r30 = 0.0; m.r31 = 0.0; m.r32 = 0.0; m.r33 = 0.0;
	det = matrix4_determinant(&m);
	test_assert(scalar_equals(det, 0));

	return NULL;
}